

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTOCTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  octet **in_RCX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  octet *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = derDec2(in_RCX,(size_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RDI != 0) {
      memMove(in_stack_ffffffffffffffc0,
              (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x12461f);
    }
    if (in_RSI != (undefined8 *)0x0) {
      *in_RSI = in_stack_ffffffffffffffc0;
    }
  }
  return local_8;
}

Assistant:

size_t derTOCTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
	{
		ASSERT(memIsValid(val, l));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l));
		memMove(val, v, l);
	}
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}